

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O3

StructType * __thiscall
deqp::gles31::bb::ShaderInterface::findStruct(ShaderInterface *this,char *name)

{
  __normal_iterator<glu::StructType_*const_*,_std::vector<glu::StructType_*,_std::allocator<glu::StructType_*>_>_>
  __last;
  __normal_iterator<glu::StructType_*const_*,_std::vector<glu::StructType_*,_std::allocator<glu::StructType_*>_>_>
  _Var1;
  StructType *pSVar2;
  allocator<char> local_41;
  long *local_40 [2];
  long local_30 [2];
  
  _Var1._M_current =
       (this->m_structs).super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (this->m_structs).super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,name,&local_41);
  _Var1 = std::
          find_if<__gnu_cxx::__normal_iterator<glu::StructType*const*,std::vector<glu::StructType*,std::allocator<glu::StructType*>>>,deqp::gles31::bb::StructNameEquals>
                    (_Var1,__last,(StructNameEquals *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  if (_Var1._M_current ==
      (this->m_structs).super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pSVar2 = (StructType *)0x0;
  }
  else {
    pSVar2 = *_Var1._M_current;
  }
  return pSVar2;
}

Assistant:

const StructType* ShaderInterface::findStruct (const char* name) const
{
	std::vector<StructType*>::const_iterator pos = std::find_if(m_structs.begin(), m_structs.end(), StructNameEquals(name));
	return pos != m_structs.end() ? *pos : DE_NULL;
}